

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O1

bool __thiscall
ON_BinaryArchive::ReadArray(ON_BinaryArchive *this,ON_SimpleArray<ON_DisplayMaterialRef> *a)

{
  bool bVar1;
  bool bVar2;
  ON_DisplayMaterialRef *uuid;
  int iVar3;
  int count;
  uint local_2c;
  
  if (a->m_a != (ON_DisplayMaterialRef *)0x0) {
    memset(a->m_a,0,(long)a->m_capacity << 5);
  }
  a->m_count = 0;
  local_2c = 0;
  bVar2 = ReadInt32(this,1,(ON__INT32 *)&local_2c);
  if (0 < (int)local_2c && bVar2) {
    ON_SimpleArray<ON_DisplayMaterialRef>::SetCapacity(a,(ulong)local_2c);
    if (bVar2 && 0 < (int)local_2c) {
      iVar3 = 1;
      do {
        uuid = ON_SimpleArray<ON_DisplayMaterialRef>::AppendNew(a);
        bVar2 = ReadUuid(this,&uuid->m_viewport_id);
        if (bVar2) {
          bVar2 = ReadUuid(this,&uuid->m_display_material_id);
        }
      } while ((bVar2 != false) && (bVar1 = iVar3 < (int)local_2c, iVar3 = iVar3 + 1, bVar1));
    }
  }
  return bVar2;
}

Assistant:

bool ON_BinaryArchive::ReadArray( ON_SimpleArray<ON_DisplayMaterialRef>& a )
{
  a.Empty();
  int count = 0;
  bool rc = ReadInt( &count );
  if ( rc && count > 0 ) 
  {
    a.SetCapacity( count );
    int i;
    for ( i = 0; i < count && rc; i++ )
    {
      rc = ReadDisplayMaterialRef(a.AppendNew());
    }
  }
  return rc;
}